

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pic.cpp
# Opt level: O0

int processPic(istream *in,path *output)

{
  vector<MaskRect,_std::allocator<MaskRect>_> *pvVar1;
  reference pvVar2;
  string *in_RSI;
  value_type *chunk;
  size_t i;
  vector<MaskRect,_std::allocator<MaskRect>_> maskData;
  Image currentChunk;
  Image result;
  PicHeader header;
  PicHeader *in_stack_fffffffffffffe58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe60;
  char *in_stack_fffffffffffffe68;
  path *filename;
  Point in_stack_fffffffffffffe70;
  Image *in_stack_fffffffffffffe80;
  undefined8 in_stack_fffffffffffffe88;
  Color base;
  Size size;
  char *in_stack_fffffffffffffe98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffea0;
  vector<MaskRect,_std::allocator<MaskRect>_> *in_stack_fffffffffffffea8;
  undefined8 in_stack_fffffffffffffeb0;
  string local_118 [32];
  string local_f8 [15];
  undefined1 in_stack_ffffffffffffff17;
  string *in_stack_ffffffffffffff18;
  istream *in_stack_ffffffffffffff20;
  uint32_t offset;
  vector<MaskRect,_std::allocator<MaskRect>_> *pvVar3;
  vector<MaskRect,_std::allocator<MaskRect>_> *outputMasks;
  Image *in_stack_ffffffffffffff38;
  vector<MaskRect,_std::allocator<MaskRect>_> *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  Point in_stack_ffffffffffffff60;
  undefined1 local_40 [24];
  vector<PicChunk,_std::allocator<PicChunk>_> local_28;
  string *local_10;
  
  base = SUB84((ulong)in_stack_fffffffffffffe88 >> 0x20,0);
  size = (Size)local_40;
  local_10 = in_RSI;
  PicHeader::PicHeader((PicHeader *)0x122289);
  operator>>((istream *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  Image::Image(in_stack_fffffffffffffe80,size,base);
  uVar5 = 0;
  uVar6 = 0;
  uVar4 = 0;
  Image::Image(in_stack_fffffffffffffe80,size,base);
  std::vector<MaskRect,_std::allocator<MaskRect>_>::vector
            ((vector<MaskRect,_std::allocator<MaskRect>_> *)0x122330);
  pvVar3 = (vector<MaskRect,_std::allocator<MaskRect>_> *)0x0;
  while( true ) {
    outputMasks = pvVar3;
    pvVar1 = (vector<MaskRect,_std::allocator<MaskRect>_> *)
             std::vector<PicChunk,_std::allocator<PicChunk>_>::size(&local_28);
    if (pvVar1 <= pvVar3) break;
    pvVar2 = std::vector<PicChunk,_std::allocator<PicChunk>_>::operator[]
                       (&local_28,(size_type)outputMasks);
    offset = (uint32_t)((ulong)pvVar2 >> 0x20);
    std::__cxx11::to_string((unsigned_long)in_stack_fffffffffffffe98);
    std::operator+(in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
    in_stack_fffffffffffffe70 =
         processChunk(in_stack_ffffffffffffff38,outputMasks,offset,in_stack_ffffffffffffff20,
                      in_stack_ffffffffffffff18,(bool)in_stack_ffffffffffffff17);
    std::__cxx11::string::~string(local_f8);
    std::__cxx11::string::~string(local_118);
    std::vector<MaskRect,_std::allocator<MaskRect>_>::vector
              ((vector<MaskRect,_std::allocator<MaskRect>_> *)in_stack_fffffffffffffeb0,
               in_stack_fffffffffffffea8);
    Image::drawOnto((Image *)CONCAT44(uVar6,uVar5),
                    (Image *)CONCAT44(uVar4,in_stack_ffffffffffffff50),in_stack_ffffffffffffff60,
                    in_stack_ffffffffffffff48);
    std::vector<MaskRect,_std::allocator<MaskRect>_>::~vector
              ((vector<MaskRect,_std::allocator<MaskRect>_> *)in_stack_fffffffffffffe70);
    pvVar3 = (vector<MaskRect,_std::allocator<MaskRect>_> *)
             ((long)&(outputMasks->super__Vector_base<MaskRect,_std::allocator<MaskRect>_>)._M_impl.
                     super__Vector_impl_data._M_start + 1);
  }
  filename = (path *)&stack0xfffffffffffffe9f;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,(allocator<char> *)size);
  Image::writePNG((Image *)in_stack_fffffffffffffe70,filename,local_10);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffea0);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffe9f);
  std::vector<MaskRect,_std::allocator<MaskRect>_>::~vector
            ((vector<MaskRect,_std::allocator<MaskRect>_> *)in_stack_fffffffffffffe70);
  Image::~Image((Image *)0x1225ec);
  Image::~Image((Image *)0x1225f9);
  PicHeader::~PicHeader((PicHeader *)0x122606);
  return 0;
}

Assistant:

int processPic(std::istream &in, const fs::path &output) {
	PicHeader header;
	in >> header;

	Image result({header.width, header.height}), currentChunk({0, 0});
	std::vector<MaskRect> maskData;

	for(size_t i = 0; i < header.chunks.size(); i++) {
		const auto &chunk = header.chunks[i];
		processChunk(currentChunk, maskData, chunk.offset, in, "chunk" + std::to_string(i), header.isSwitch);
		currentChunk.drawOnto(result, {chunk.x, chunk.y}, maskData);
	}

	result.writePNG(output);
	return 0;
}